

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::block_is_noop(Compiler *this,SPIRBlock *block)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIRBlock *pSVar5;
  Phi *pPVar6;
  Instruction *pIVar7;
  uint32_t *puVar8;
  SPIRExtension *pSVar9;
  bool bVar10;
  bool ext_is_nonsemantic_only;
  Extension ext;
  uint32_t *ops;
  Op op;
  Instruction *i;
  Instruction *__end1_2;
  Instruction *__begin1_2;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1_2;
  Phi *phi_1;
  Phi *__end1_1;
  Phi *__begin1_1;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range1_1;
  Phi *phi;
  Phi *__end1;
  Phi *__begin1;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range1;
  SPIRBlock *child;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  if (*(int *)&(block->super_IVariant).field_0xc == 1) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->next_block);
    pSVar5 = get<spirv_cross::SPIRBlock>(this,uVar3);
    __end1 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                       (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
    pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                       (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
    for (; __end1 != pPVar6; __end1 = __end1 + 1) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->parent);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
      if (uVar3 == uVar4) {
        return false;
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->parent);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar5->super_IVariant).self);
      if (uVar3 == uVar4) {
        return false;
      }
    }
    __end1_1 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                         (&(pSVar5->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
    pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                       (&(pSVar5->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
    for (; __end1_1 != pPVar6; __end1_1 = __end1_1 + 1) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1_1->parent);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
      if (uVar3 == uVar4) {
        return false;
      }
    }
    __end1_2 = VectorView<spirv_cross::Instruction>::begin
                         (&(block->ops).super_VectorView<spirv_cross::Instruction>);
    pIVar7 = VectorView<spirv_cross::Instruction>::end
                       (&(block->ops).super_VectorView<spirv_cross::Instruction>);
    for (; __end1_2 != pIVar7; __end1_2 = __end1_2 + 1) {
      uVar1 = __end1_2->op;
      if (uVar1 != 8) {
        if (uVar1 == 0xc) {
          puVar8 = stream(this,__end1_2);
          pSVar9 = get<spirv_cross::SPIRExtension>(this,puVar8[2]);
          iVar2 = *(int *)&(pSVar9->super_IVariant).field_0xc;
          bVar10 = true;
          if ((iVar2 != 8) && (bVar10 = true, iVar2 != 2)) {
            bVar10 = iVar2 == 9;
          }
          if (!bVar10) {
            return false;
          }
        }
        else if (uVar1 != 0x13d) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::block_is_noop(const SPIRBlock &block) const
{
	if (block.terminator != SPIRBlock::Direct)
		return false;

	auto &child = get<SPIRBlock>(block.next_block);

	// If this block participates in PHI, the block isn't really noop.
	for (auto &phi : block.phi_variables)
		if (phi.parent == block.self || phi.parent == child.self)
			return false;

	for (auto &phi : child.phi_variables)
		if (phi.parent == block.self)
			return false;

	// Verify all instructions have no semantic impact.
	for (auto &i : block.ops)
	{
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		// Non-Semantic instructions.
		case OpLine:
		case OpNoLine:
			break;

		case OpExtInst:
		{
			auto *ops = stream(i);
			auto ext = get<SPIRExtension>(ops[2]).ext;

			bool ext_is_nonsemantic_only =
				ext == SPIRExtension::NonSemanticShaderDebugInfo ||
				ext == SPIRExtension::SPV_debug_info ||
				ext == SPIRExtension::NonSemanticGeneric;

			if (!ext_is_nonsemantic_only)
				return false;

			break;
		}

		default:
			return false;
		}
	}

	return true;
}